

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O2

void __thiscall
fizplex::SimplexTest_LowerRowLowerVarInfeasible_Test::TestBody
          (SimplexTest_LowerRowLowerVarInfeasible_Test *this)

{
  LP *this_00;
  char *message;
  initializer_list<double> l;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  DVector local_38;
  
  this_00 = &(this->super_SimplexTest).lp;
  LP::add_column(this_00,LowerBound,1.0,INFINITY,2.0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x3ff00000000000;
  l._M_len = 1;
  l._M_array = (iterator)&gtest_ar;
  DVector::DVector(&local_38,l);
  LP::add_row(this_00,LE,-INFINITY,0.0,&local_38);
  operator_delete(local_38.vals._M_data);
  SimplexTest::solve_lp(&this->super_SimplexTest);
  local_58.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((internal *)&gtest_ar,"Simplex::Result::Infeasible","result",(Result *)&local_58,
             &(this->super_SimplexTest).result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x81,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowLowerVarInfeasible) {
  lp.add_column(ColType::LowerBound, 1.0, inf, 2);
  lp.add_row(RowType::LE, -inf, 0, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::Infeasible, result);
}